

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall
minja::Value::call(Value *this,shared_ptr<minja::Context> *context,ArgumentsValue *args)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)> *in_RSI;
  Value *in_RDI;
  bool in_stack_00000113;
  int in_stack_00000114;
  Value *in_stack_00000118;
  __shared_ptr_access<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff70;
  Value *__args;
  string local_40 [64];
  
  __args = in_RDI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)&in_RSI[1].super__Function_base._M_manager);
  if (!bVar1) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    dump_abi_cxx11_(in_stack_00000118,in_stack_00000114,in_stack_00000113);
    std::operator+((char *)in_RDI,__rhs);
    std::runtime_error::runtime_error((runtime_error *)__rhs,local_40);
    __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  __shared_ptr_access<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*(in_stack_ffffffffffffff70);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>::
  operator()(in_RSI,(shared_ptr<minja::Context> *)__args,(ArgumentsValue *)in_RDI);
  return __args;
}

Assistant:

Value call(const std::shared_ptr<Context> & context, ArgumentsValue & args) const {
    if (!callable_) throw std::runtime_error("Value is not callable: " + dump());
    return (*callable_)(context, args);
  }